

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

float __thiscall slang::SVInt::toFloat(SVInt *this)

{
  uint uVar1;
  char cVar2;
  bool bVar3;
  logic_t lVar4;
  bitwidth_t bVar5;
  _Storage<unsigned_long,_true> _Var6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  optional<long> oVar14;
  optional<unsigned_long> oVar15;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_38;
  uint local_30;
  char local_2c;
  byte local_2b;
  float local_24;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_20;
  uint local_18;
  byte local_13;
  
  SVInt((SVInt *)&local_38,&this->super_SVIntStorage);
  if (local_2b == 1) {
    flattenUnknowns((SVInt *)&local_38);
  }
  if (local_2c == '\x01') {
    oVar14 = as<long>((SVInt *)&local_38);
    _Var6._M_value =
         oVar14.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
         ._M_payload;
    if (((undefined1  [16])
         oVar14.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
        & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
LAB_00225ef8:
      local_24 = (float)(long)_Var6._M_value;
      goto LAB_0022608f;
    }
  }
  else {
    oVar15 = as<unsigned_long>((SVInt *)&local_38);
    _Var6._M_value =
         oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    if (((undefined1  [16])
         oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) {
      if ((long)_Var6._M_value < 0) {
        local_24 = (float)((ulong)(oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload
                                   .super__Optional_payload_base<unsigned_long>._M_payload._0_4_ & 1
                                  ) | _Var6._M_value >> 1);
        local_24 = local_24 + local_24;
        goto LAB_0022608f;
      }
      goto LAB_00225ef8;
    }
  }
  if (local_2c == '\x01') {
    lVar4 = operator[]((SVInt *)&local_38,local_30 - 1);
    bVar3 = false;
    if (((lVar4.value != '\0') && (bVar3 = false, lVar4.value != '@')) && (lVar4.value != 0x80)) {
      operator-((SVInt *)&local_20);
      operator=((SVInt *)&local_38,(SVInt *)&local_20);
      if (((0x40 < local_18) || ((local_13 & 1) != 0)) && ((void *)local_20.val != (void *)0x0)) {
        operator_delete__(local_20.pVal);
      }
      bVar3 = true;
    }
  }
  else {
    bVar3 = false;
  }
  bVar5 = getActiveBits((SVInt *)&local_38);
  uVar1 = bVar5 - 1;
  uVar11 = uVar1 >> 6;
  uVar9 = 0x40;
  if ((bVar5 & 0x3f) != 0) {
    uVar9 = bVar5 & 0x3f;
  }
  aVar10.pVal = (uint64_t *)&local_38;
  if ((local_2b & 1) != 0) {
    aVar10 = local_38;
  }
  if (0x40 < local_30) {
    aVar10 = local_38;
  }
  uVar7 = aVar10.pVal[uVar11];
  cVar2 = (char)uVar9;
  if (uVar1 < 0x40 || 0x17 < uVar9) {
    if (0x18 < uVar9) {
      uVar12 = ~(-1L << (cVar2 - 0x18U & 0x3f)) & uVar7;
      bVar8 = cVar2 - 0x19;
      uVar7 = uVar7 >> (cVar2 - 0x18U & 0x3f);
      goto LAB_00225ffb;
    }
  }
  else {
    uVar11 = uVar11 - 1;
    bVar8 = cVar2 + 0x28U & 0x3f;
    uVar7 = aVar10.pVal[uVar11] >> bVar8 | uVar7 << 0x40 - bVar8;
    uVar12 = ~(-1L << (cVar2 + 0x28U & 0x3f)) & aVar10.pVal[uVar11];
    bVar8 = cVar2 + 0x27;
LAB_00225ffb:
    uVar13 = 1L << (bVar8 & 0x3f);
    if (uVar13 < uVar12) {
LAB_0022600b:
      uVar7 = uVar7 + 1;
    }
    else if (uVar12 == uVar13) {
      if ((uVar7 & 1) != 0) goto LAB_0022600b;
      if (uVar11 != 0) {
        uVar7 = uVar7 | aVar10.pVal[uVar11 - 1] != 0;
      }
    }
  }
  uVar12 = (ulong)(uVar7 == 0x1000000) + (ulong)uVar1;
  if (uVar12 < 0x80) {
    local_24 = (float)((uint)uVar7 & 0x7fffff |
                      (uint)bVar3 << 0x1f | (int)uVar12 * 0x800000 + 0x3f800000U);
  }
  else if (bVar3) {
    local_24 = -INFINITY;
  }
  else {
    local_24 = INFINITY;
  }
LAB_0022608f:
  if (((0x40 < local_30) || ((local_2b & 1) != 0)) &&
     ((undefined1 *)local_38.val != (undefined1 *)0x0)) {
    operator_delete__(local_38.pVal);
  }
  return local_24;
}

Assistant:

float SVInt::toFloat() const {
    return toIEEE754<float, 8, 23, 127>(*this);
}